

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O2

Matrix<Rational> * __thiscall Matrix<Rational>::operator/=(Matrix<Rational> *this,Rational *a)

{
  Matrix<Rational> *pMVar1;
  Rational RStack_98;
  Rational local_58;
  
  Rational::Rational(&local_58,1);
  ::operator/(&RStack_98,&local_58,a);
  pMVar1 = operator*=(this,&RStack_98);
  Rational::~Rational(&RStack_98);
  Rational::~Rational(&local_58);
  return pMVar1;
}

Assistant:

inline Matrix &operator/=(Field a)
    {
        return operator*=(Field(1) / a);
    }